

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
RegisterBuildTestDyndepReadySyntaxError::RegisterBuildTestDyndepReadySyntaxError
          (RegisterBuildTestDyndepReadySyntaxError *this)

{
  RegisterBuildTestDyndepReadySyntaxError *this_local;
  
  RegisterTest(BuildTestDyndepReadySyntaxError::Create,"BuildTest.DyndepReadySyntaxError");
  return;
}

Assistant:

TEST_F(BuildTest, DyndepReadySyntaxError) {
  // Verify that a dyndep file can be loaded immediately to discover
  // and reject a syntax error in it.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"build out: touch || dd\n"
"  dyndep = dd\n"
));
  fs_.Create("dd",
"build out: dyndep\n"
);

  string err;
  EXPECT_FALSE(builder_.AddTarget("out", &err));
  EXPECT_EQ("dd:1: expected 'ninja_dyndep_version = ...'\n", err);
}